

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChMatterSPH.cpp
# Opt level: O3

void __thiscall chrono::ChMatterSPH::AddCollisionModelsToSystem(ChMatterSPH *this)

{
  ChSystem *pCVar1;
  element_type *peVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  bool bVar3;
  pointer psVar4;
  ulong uVar5;
  ulong uVar6;
  
  if ((this->super_ChIndexedNodes).super_ChPhysicsItem.system != (ChSystem *)0x0) {
    (*(this->super_ChIndexedNodes).super_ChPhysicsItem.super_ChObj._vptr_ChObj[0xb])();
    psVar4 = (this->nodes).
             super__Vector_base<std::shared_ptr<chrono::ChNodeSPH>,_std::allocator<std::shared_ptr<chrono::ChNodeSPH>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((this->nodes).
        super__Vector_base<std::shared_ptr<chrono::ChNodeSPH>,_std::allocator<std::shared_ptr<chrono::ChNodeSPH>_>_>
        ._M_impl.super__Vector_impl_data._M_finish != psVar4) {
      uVar5 = 0;
      uVar6 = 1;
      do {
        pCVar1 = (this->super_ChIndexedNodes).super_ChPhysicsItem.system;
        peVar2 = (pCVar1->collision_system).
                 super___shared_ptr<chrono::collision::ChCollisionSystem,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr;
        this_00 = (pCVar1->collision_system).
                  super___shared_ptr<chrono::collision::ChCollisionSystem,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount._M_pi;
        if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            this_00->_M_use_count = this_00->_M_use_count + 1;
            UNLOCK();
            psVar4 = (this->nodes).
                     super__Vector_base<std::shared_ptr<chrono::ChNodeSPH>,_std::allocator<std::shared_ptr<chrono::ChNodeSPH>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
          }
          else {
            this_00->_M_use_count = this_00->_M_use_count + 1;
          }
        }
        (*peVar2->_vptr_ChCollisionSystem[4])
                  (peVar2,(psVar4[uVar5].
                           super___shared_ptr<chrono::ChNodeSPH,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                          ->collision_model);
        if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
        }
        psVar4 = (this->nodes).
                 super__Vector_base<std::shared_ptr<chrono::ChNodeSPH>,_std::allocator<std::shared_ptr<chrono::ChNodeSPH>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        bVar3 = uVar6 < (ulong)((long)(this->nodes).
                                      super__Vector_base<std::shared_ptr<chrono::ChNodeSPH>,_std::allocator<std::shared_ptr<chrono::ChNodeSPH>_>_>
                                      ._M_impl.super__Vector_impl_data._M_finish - (long)psVar4 >> 4
                               );
        uVar5 = uVar6;
        uVar6 = (ulong)((int)uVar6 + 1);
      } while (bVar3);
    }
    return;
  }
  __assert_fail("GetSystem()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/physics/ChMatterSPH.cpp"
                ,0x274,"virtual void chrono::ChMatterSPH::AddCollisionModelsToSystem()");
}

Assistant:

void ChMatterSPH::AddCollisionModelsToSystem() {
    assert(GetSystem());
    SyncCollisionModels();
    for (unsigned int j = 0; j < nodes.size(); j++) {
        GetSystem()->GetCollisionSystem()->Add(nodes[j]->collision_model);
    }
}